

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> *field)

{
  MemoryModuleField *pMVar1;
  long lVar2;
  ModuleFieldList *pMVar3;
  Memory *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pMVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
           .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl;
  if (*(long *)(pMVar1 + 0x48) != 0) {
    local_48 = *(Memory **)(pMVar1 + 0x18);
    uStack_40 = *(undefined4 *)(pMVar1 + 0x20);
    uStack_3c = *(undefined4 *)(pMVar1 + 0x24);
    local_38 = *(undefined4 *)(pMVar1 + 0x28);
    uStack_34 = *(undefined4 *)(pMVar1 + 0x2c);
    uStack_30 = *(undefined4 *)(pMVar1 + 0x30);
    uStack_2c = *(undefined4 *)(pMVar1 + 0x34);
    local_28 = (undefined4)((ulong)(*(long *)&this->field_0x138 - *(long *)&this->memories) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->memory_bindings,0,pMVar1 + 0x40);
  }
  local_48 = (Memory *)(pMVar1 + 0x40);
  std::vector<wabt::Memory*,std::allocator<wabt::Memory*>>::emplace_back<wabt::Memory*>
            ((vector<wabt::Memory*,std::allocator<wabt::Memory*>> *)&this->memories,&local_48);
  pMVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
           .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
  super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl = (MemoryModuleField *)0x0;
  if ((*(long *)(pMVar1 + 0x10) == 0) && (*(long *)(pMVar1 + 8) == 0)) {
    lVar2 = *(long *)&this->field_0x48;
    if (lVar2 == 0) {
      pMVar3 = &this->fields;
    }
    else {
      *(long *)(pMVar1 + 0x10) = lVar2;
      pMVar3 = (ModuleFieldList *)(lVar2 + 8);
    }
    *(MemoryModuleField **)pMVar3 = pMVar1;
    *(MemoryModuleField **)&this->field_0x48 = pMVar1;
    *(long *)&this->field_0x50 = *(long *)&this->field_0x50 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<MemoryModuleField> field) {
  Memory& memory = field->memory;
  if (!memory.name.empty()) {
    memory_bindings.emplace(memory.name, Binding(field->loc, memories.size()));
  }
  memories.push_back(&memory);
  fields.push_back(std::move(field));
}